

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_get_wcs(archive *a,archive_mstring *aes,wchar_t **wp)

{
  wchar_t wVar1;
  undefined8 *in_RDX;
  long in_RSI;
  wchar_t ret;
  wchar_t r;
  char *in_stack_00000020;
  archive_wstring *in_stack_00000028;
  undefined4 local_28;
  undefined4 local_4;
  
  local_28 = L'\0';
  if ((*(uint *)(in_RSI + 0x60) & 4) == 0) {
    *in_RDX = 0;
    if ((*(uint *)(in_RSI + 0x60) & 1) != 0) {
      *(undefined8 *)(in_RSI + 0x38) = 0;
      wVar1 = archive_wstring_append_from_mbs(in_stack_00000028,in_stack_00000020,(size_t)a);
      if (wVar1 == L'\0') {
        *(uint *)(in_RSI + 0x60) = *(uint *)(in_RSI + 0x60) | 4;
        *in_RDX = *(undefined8 *)(in_RSI + 0x30);
      }
      else {
        local_28 = L'\xffffffff';
      }
    }
    local_4 = local_28;
  }
  else {
    *in_RDX = *(undefined8 *)(in_RSI + 0x30);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
archive_mstring_get_wcs(struct archive *a, struct archive_mstring *aes,
    const wchar_t **wp)
{
	int r, ret = 0;

	(void)a;/* UNUSED */
	/* Return WCS form if we already have it. */
	if (aes->aes_set & AES_SET_WCS) {
		*wp = aes->aes_wcs.s;
		return (ret);
	}

	*wp = NULL;
	/* Try converting MBS to WCS using native locale. */
	if (aes->aes_set & AES_SET_MBS) {
		archive_wstring_empty(&(aes->aes_wcs));
		r = archive_wstring_append_from_mbs(&(aes->aes_wcs),
		    aes->aes_mbs.s, aes->aes_mbs.length);
		if (r == 0) {
			aes->aes_set |= AES_SET_WCS;
			*wp = aes->aes_wcs.s;
		} else
			ret = -1;/* failure. */
	}
	return (ret);
}